

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_function_set.cpp
# Opt level: O1

BoundCastInfo * __thiscall
duckdb::CastFunctionSet::GetCastFunction
          (BoundCastInfo *__return_storage_ptr__,CastFunctionSet *this,LogicalType *source,
          LogicalType *target,GetCastFunctionInput *get_input)

{
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> _Var1;
  bool bVar2;
  reference pvVar3;
  long lVar4;
  size_type __n;
  size_type sVar5;
  BindCastInput input;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_80;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_78;
  CastFunctionSet *local_70;
  vector<duckdb::BindCastFunction,_true> *local_68;
  LogicalType *local_60;
  LogicalType *local_58;
  BindCastInput local_50;
  
  local_60 = source;
  local_58 = target;
  bVar2 = LogicalType::operator==(source,target);
  if (bVar2) {
    local_78._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,DefaultCasts::NopCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_78,(init_cast_local_state_t)0x0);
    if (local_78._M_head_impl != (BoundCastData *)0x0) {
      (*(local_78._M_head_impl)->_vptr_BoundCastData[1])();
    }
  }
  else {
    lVar4 = (long)(this->bind_functions).
                  super_vector<duckdb::BindCastFunction,_std::allocator<duckdb::BindCastFunction>_>.
                  super__Vector_base<duckdb::BindCastFunction,_std::allocator<duckdb::BindCastFunction>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->bind_functions).
                  super_vector<duckdb::BindCastFunction,_std::allocator<duckdb::BindCastFunction>_>.
                  super__Vector_base<duckdb::BindCastFunction,_std::allocator<duckdb::BindCastFunction>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    bVar2 = lVar4 == 0;
    local_70 = this;
    if (!bVar2) {
      local_68 = &this->bind_functions;
      sVar5 = lVar4 >> 4;
      do {
        __n = sVar5 - 1;
        pvVar3 = vector<duckdb::BindCastFunction,_true>::operator[](local_68,__n);
        BindCastInput::BindCastInput
                  (&local_50,local_70,
                   (optional_ptr<duckdb::BindCastInfo,_true>)
                   (pvVar3->info).
                   super_unique_ptr<duckdb::BindCastInfo,_std::default_delete<duckdb::BindCastInfo>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::BindCastInfo,_std::default_delete<duckdb::BindCastInfo>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::BindCastInfo_*,_std::default_delete<duckdb::BindCastInfo>_>
                   .super__Head_base<0UL,_duckdb::BindCastInfo_*,_false>._M_head_impl,
                   (get_input->context).ptr);
        local_50.query_location.index = (get_input->query_location).index;
        (*pvVar3->function)(__return_storage_ptr__,&local_50,local_60,local_58);
        if (__return_storage_ptr__->function != (cast_function_t)0x0) {
          if (!bVar2) {
            return __return_storage_ptr__;
          }
          break;
        }
        _Var1._M_head_impl =
             (__return_storage_ptr__->cast_data).
             super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
             .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
        if (_Var1._M_head_impl != (BoundCastData *)0x0) {
          (*(_Var1._M_head_impl)->_vptr_BoundCastData[1])();
        }
        bVar2 = sVar5 == 1;
        (__return_storage_ptr__->cast_data).
        super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t.
        super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
        .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl = (BoundCastData *)0x0;
        sVar5 = __n;
      } while (__n != 0);
    }
    local_80._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,DefaultCasts::TryVectorNullCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_80,(init_cast_local_state_t)0x0);
    if (local_80._M_head_impl != (BoundCastData *)0x0) {
      (*(local_80._M_head_impl)->_vptr_BoundCastData[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo CastFunctionSet::GetCastFunction(const LogicalType &source, const LogicalType &target,
                                               GetCastFunctionInput &get_input) {
	if (source == target) {
		return DefaultCasts::NopCast;
	}
	// the first function is the default
	// we iterate the set of bind functions backwards
	for (idx_t i = bind_functions.size(); i > 0; i--) {
		auto &bind_function = bind_functions[i - 1];
		BindCastInput input(*this, bind_function.info.get(), get_input.context);
		input.query_location = get_input.query_location;
		auto result = bind_function.function(input, source, target);
		if (result.function) {
			// found a cast function! return it
			return result;
		}
	}
	// no cast found: return the default null cast
	return DefaultCasts::TryVectorNullCast;
}